

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O0

int __thiscall loser_tree<int>::min(loser_tree<int> *this)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  Stream *pSVar4;
  size_t sVar5;
  int ret;
  loser_tree<int> *this_local;
  
  if (this->_nonempty_streams == 0) {
    __assert_fail("_nonempty_streams",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                  ,0x9d,"T loser_tree<int>::min() [T = int]");
  }
  pSVar4 = node2stream(this,0);
  bVar3 = stream_empty(this,pSVar4);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("not stream_empty(node2stream(0))",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                  ,0x9e,"T loser_tree<int>::min() [T = int]");
  }
  pSVar4 = node2stream(this,0);
  piVar2 = pSVar4->stream;
  pSVar4->stream = piVar2 + 1;
  iVar1 = *piVar2;
  pSVar4 = node2stream(this,0);
  sVar5 = pSVar4->n - 1;
  pSVar4->n = sVar5;
  if (sVar5 == 0) {
    this->_nonempty_streams = this->_nonempty_streams - 1;
  }
  update(this);
  return iVar1;
}

Assistant:

T min()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		assert(_nonempty_streams);
		assert(not stream_empty(node2stream(0)));
		T ret = *(node2stream(0).stream++);
		if (--node2stream(0).n == size_t(0)) { --_nonempty_streams; }
		update();
		//debug() << "\t -> " << ret << std::endl;
		return ret;
	}